

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SliceBase.h
# Opt level: O3

uint32_t __thiscall
arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
hashString32(SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *this,uint32_t seed
            )

{
  byte *input;
  XXH32_hash_t XVar1;
  size_t len;
  
  input = *(byte **)this;
  if ((ulong)*input == 0xbf) {
    len = *(long *)(input + 1) + 9;
  }
  else {
    len = (ulong)*input - 0x3f;
  }
  XVar1 = VELOCYPACK_XXH32(input,len,seed);
  return XVar1;
}

Assistant:

inline uint32_t hashString32(uint32_t seed = defaultSeed32) const noexcept {
    return VELOCYPACK_HASH32(
        start(), static_cast<std::size_t>(stringSliceLength()), seed);
  }